

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TerragenLoader.cpp
# Opt level: O1

bool __thiscall
Assimp::TerragenImporter::CanRead
          (TerragenImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  int iVar2;
  string extension;
  char *tokens [1];
  string local_48;
  char *local_28;
  
  BaseImporter::GetExtension(&local_48,pFile);
  iVar2 = std::__cxx11::string::compare((char *)&local_48);
  bVar1 = true;
  if (iVar2 != 0) {
    if (local_48._M_string_length == 0 || checkSig) {
      if (pIOHandler != (IOSystem *)0x0) {
        local_28 = "terragen";
        bVar1 = BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,&local_28,1,200,false,false)
        ;
      }
    }
    else {
      bVar1 = false;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool TerragenImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    // check file extension
    std::string extension = GetExtension(pFile);

    if( extension == "ter")
        return true;

    if(  !extension.length() || checkSig)   {
        /*  If CanRead() is called in order to check whether we
         *  support a specific file extension in general pIOHandler
         *  might be NULL and it's our duty to return true here.
         */
        if (!pIOHandler)return true;
        const char* tokens[] = {"terragen"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,1);
    }
    return false;
}